

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
CreateContextCore(JsRuntimeHandle runtimeHandle,TTDRecorder *_actionEntryPopper,bool inRecordMode,
                 bool activelyRecording,bool inReplayMode,JsContextRef *newContext)

{
  DWORD *pDVar1;
  ThreadContext *threadContext;
  ScriptContext *ctx;
  bool bVar2;
  bool debugMode;
  JsrtContext *externalCtx;
  JsrtDebugManager *pJVar3;
  JsrtRuntime *runtime;
  JsErrorCode JVar4;
  undefined1 local_98 [8];
  HostScriptContextCallbackFunctor callbackFunctor;
  ThreadContextScope scope;
  EventLogEntry *local_50;
  
  ThreadContext::ValidateThreadContext(*runtimeHandle);
  threadContext = *runtimeHandle;
  if ((threadContext->recycler != (Recycler *)0x0) &&
     (bVar2 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler), bVar2)) {
    return JsErrorHeapEnumInProgress;
  }
  JVar4 = JsErrorInThreadServiceCallback;
  if ((threadContext->threadService).isInCallback == false) {
    ThreadContextScope::ThreadContextScope
              ((ThreadContextScope *)&callbackFunctor.pfOnBPClearDocumentCallback,threadContext);
    JVar4 = JsErrorWrongThread;
    if (callbackFunctor.pfOnBPClearDocumentCallback._1_1_ == '\x01') {
      if (activelyRecording) {
        local_50 = TTD::EventLog::RecordJsRTCreateScriptContext
                             (threadContext->TTDLog,_actionEntryPopper);
      }
      else {
        local_50 = (EventLogEntry *)0x0;
      }
      externalCtx = JsrtContext::New((JsrtRuntime *)runtimeHandle);
      if (inReplayMode || inRecordMode) {
        ctx = (((externalCtx->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
              ptr;
        callbackFunctor.HostRuntime = OnScriptLoad_TTDCallback;
        callbackFunctor.pfOnScriptLoadCallback = OnBPRegister_TTDCallback;
        callbackFunctor.pfOnBPRegisterCallback = OnBPDelete_TTDCallback;
        callbackFunctor.pfOnBPDeleteCallback = OnBPClearDocument_TTDCallback;
        local_98 = (undefined1  [8])externalCtx;
        callbackFunctor.HostContext = (FinalizableObject *)runtimeHandle;
        bVar2 = TTD::EventLog::IsDebugModeFlagSet(threadContext->TTDLog);
        debugMode = TTD::EventLog::IsDebugModeFlagSet(threadContext->TTDLog);
        TTD::EventLog::PushMode(threadContext->TTDLog,ExcludedExecutionTTAction);
        if (inRecordMode) {
          TTD::ThreadContextTTD::AddNewScriptContextRecord
                    (threadContext->TTDContext,&externalCtx->super_FinalizableObject,ctx,
                     (HostScriptContextCallbackFunctor *)local_98,bVar2,debugMode);
        }
        else {
          TTD::ThreadContextTTD::AddNewScriptContextReplay
                    (threadContext->TTDContext,&externalCtx->super_FinalizableObject,ctx,
                     (HostScriptContextCallbackFunctor *)local_98,bVar2,debugMode);
        }
        TTD::EventLog::SetModeFlagsOnContext(threadContext->TTDLog,ctx);
        TTD::EventLog::PopMode(threadContext->TTDLog,ExcludedExecutionTTAction);
      }
      pJVar3 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
      if (pJVar3 != (JsrtDebugManager *)0x0) {
        pDVar1 = &threadContext->debugManager->localsDisplayFlags;
        *pDVar1 = *pDVar1 | 1;
        Js::ScriptContext::GetDebugContext
                  ((((externalCtx->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr);
      }
      if (activelyRecording) {
        TTD::EventLog::RecordJsRTCreateScriptContextResult
                  (threadContext->TTDLog,local_50,
                   (((externalCtx->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr);
      }
      *newContext = externalCtx;
      JVar4 = JsNoError;
    }
    ThreadContextScope::~ThreadContextScope
              ((ThreadContextScope *)&callbackFunctor.pfOnBPClearDocumentCallback);
  }
  return JVar4;
}

Assistant:

JsErrorCode CreateContextCore(_In_ JsRuntimeHandle runtimeHandle, _In_ TTDRecorder& _actionEntryPopper, _In_ bool inRecordMode, _In_ bool activelyRecording, _In_ bool inReplayMode, _Out_ JsContextRef *newContext)
{
    JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
    ThreadContext * threadContext = runtime->GetThreadContext();

    if(threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if(threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    ThreadContextScope scope(threadContext);

    if(!scope.IsValid())
    {
        return JsErrorWrongThread;
    }

#if ENABLE_TTD
    TTD::NSLogEvents::EventLogEntry* createEvent = nullptr;
    if(activelyRecording)
    {
        createEvent = threadContext->TTDLog->RecordJsRTCreateScriptContext(_actionEntryPopper);
    }
#endif

    JsrtContext * context = JsrtContext::New(runtime);

#if ENABLE_TTD
    if(inRecordMode | inReplayMode)
    {
        Js::ScriptContext* scriptContext = context->GetScriptContext();
        HostScriptContextCallbackFunctor callbackFunctor((FinalizableObject*)context, (void*)runtime, &OnScriptLoad_TTDCallback, &OnBPRegister_TTDCallback, &OnBPDelete_TTDCallback, &OnBPClearDocument_TTDCallback);

#if ENABLE_TTD_DIAGNOSTICS_TRACING
        bool noNative = true;
        bool doDebug = true;
#else
        bool noNative = TTD_FORCE_NOJIT_MODE || threadContext->TTDLog->IsDebugModeFlagSet();
        bool doDebug = TTD_FORCE_DEBUG_MODE || threadContext->TTDLog->IsDebugModeFlagSet();
#endif

        threadContext->TTDLog->PushMode(TTD::TTDMode::ExcludedExecutionTTAction);
        if(inRecordMode)
        {
            threadContext->TTDContext->AddNewScriptContextRecord(context, scriptContext, callbackFunctor, noNative, doDebug);
        }
        else
        {
            threadContext->TTDContext->AddNewScriptContextReplay(context, scriptContext, callbackFunctor, noNative, doDebug);
        }

        threadContext->TTDLog->SetModeFlagsOnContext(scriptContext);
        threadContext->TTDLog->PopMode(TTD::TTDMode::ExcludedExecutionTTAction);
    }
#endif

#ifdef ENABLE_SCRIPT_DEBUGGING
    JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

    if(jsrtDebugManager != nullptr)
    {
        // JsDiagStartDebugging was called
        threadContext->GetDebugManager()->SetLocalsDisplayFlags(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods);

        Js::ScriptContext* scriptContext = context->GetScriptContext();

        Js::DebugContext* debugContext = scriptContext->GetDebugContext();
        debugContext->SetHostDebugContext(jsrtDebugManager);

        if (!jsrtDebugManager->IsDebugEventCallbackSet())
        {
            // JsDiagStopDebugging was called so we need to be in SourceRunDownMode
            debugContext->SetDebuggerMode(Js::DebuggerMode::SourceRundown);
        }
        else
        {
            // Set Debugging mode
            scriptContext->InitializeDebugging();
            Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
            probeContainer->InitializeInlineBreakEngine(jsrtDebugManager);
            probeContainer->InitializeDebuggerScriptOptionCallback(jsrtDebugManager);
        }
    }
#endif

#if ENABLE_TTD
    if(activelyRecording)
    {
        threadContext->TTDLog->RecordJsRTCreateScriptContextResult(createEvent, context->GetScriptContext());
    }
#endif

    *newContext = (JsContextRef)context;
    return JsNoError;
}